

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple8b.h
# Opt level: O0

bool FastPForLib::Simple8b<true>::trymefull<60u,1u>(uint32_t *n)

{
  uint32_t i;
  uint32_t *n_local;
  
  i = 0;
  while( true ) {
    if (0x3b < i) {
      return true;
    }
    if (1 < n[i]) break;
    i = i + 1;
  }
  return false;
}

Assistant:

static bool trymefull(const uint32_t *n) {
    if (log1 >= 32)
      return true;
    for (uint32_t i = 0; i < num1; i++) {
      if (n[i] >= (1U << (log1 % 32)))
        return false;
    }
    return true;
  }